

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  char *ptr;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = (ctx->Tables).Buf.Size;
  uVar2 = (ulong)uVar1;
  if (uVar1 != 0) {
    lVar3 = 100;
    uVar4 = 0;
    do {
      if ((long)(int)uVar2 <= (long)uVar4) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      *(undefined4 *)((long)&((ctx->Tables).Buf.Data)->ID + lVar3) = 0xffffffff;
      uVar4 = uVar4 + 1;
      uVar2 = (ulong)(uint)(ctx->Tables).Buf.Size;
      lVar3 = lVar3 + 0x1e0;
    } while (uVar4 != uVar2);
  }
  ptr = (ctx->SettingsTables).Buf.Data;
  if (ptr != (char *)0x0) {
    (ctx->SettingsTables).Buf.Size = 0;
    (ctx->SettingsTables).Buf.Capacity = 0;
    ImGui::MemFree(ptr);
    (ctx->SettingsTables).Buf.Data = (char *)0x0;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
        g.Tables.GetByIndex(i)->SettingsOffset = -1;
    g.SettingsTables.clear();
}